

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cVertexAttrib64BitTest.cpp
# Opt level: O0

void __thiscall VertexAttrib64Bit::ApiErrorsTest::invalidOperation(ApiErrorsTest *this,bool *result)

{
  GLenum err;
  ostream *poVar1;
  char *function_name;
  string local_1e0 [48];
  stringstream local_1b0 [8];
  stringstream message;
  ostream local_1a0;
  GLvoid *local_28;
  GLvoid *pointer;
  bool *pbStack_18;
  GLuint i;
  bool *result_local;
  ApiErrorsTest *this_local;
  
  pbStack_18 = result;
  result_local = (bool *)this;
  (*(this->super_Base).gl.bindBuffer)(0x8892,0);
  err = (*(this->super_Base).gl.getError)();
  glu::checkError(err,"BindBuffer",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cVertexAttrib64BitTest.cpp"
                  ,0x1b5);
  for (pointer._4_4_ = 0; pointer._4_4_ < 3; pointer._4_4_ = pointer._4_4_ + 1) {
    local_28 = invalidOperation::pointer_array[pointer._4_4_];
    std::__cxx11::stringstream::stringstream(local_1b0);
    poVar1 = std::operator<<(&local_1a0,"VertexAttribLPointer(..., ");
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,local_28);
    std::operator<<(poVar1," /* pointer */)");
    (*(this->super_Base).gl.vertexAttribLPointer)(1,4,0x140a,0,local_28);
    std::__cxx11::stringstream::str();
    function_name = (char *)std::__cxx11::string::c_str();
    verifyError(this,0x502,function_name,0x1bf,pbStack_18);
    std::__cxx11::string::~string(local_1e0);
    std::__cxx11::stringstream::~stringstream(local_1b0);
  }
  return;
}

Assistant:

void ApiErrorsTest::invalidOperation(bool& result)
{

	/*
	 *e) GL_INVALID_OPERATION should be generated by glVertexAttribLPointer()
	 *   if zero is bound to the GL_ARRAY_BUFFER buffer object binding
	 *   point and the <pointer> argument is not NULL.
	 */
	static const GLvoid* pointer_array[]	  = { (GLvoid*)1, (GLvoid*)4, (GLvoid*)-16 };
	static const GLuint  pointer_array_length = sizeof(pointer_array) / sizeof(pointer_array[0]);

	gl.bindBuffer(GL_ARRAY_BUFFER, 0);
	GLU_EXPECT_NO_ERROR(gl.getError(), "BindBuffer");

	for (GLuint i = 0; i < pointer_array_length; ++i)
	{
		const GLvoid* pointer = pointer_array[i];

		std::stringstream message;
		message << "VertexAttribLPointer(..., " << pointer << " /* pointer */)";

		gl.vertexAttribLPointer(1 /* index */, 4 /*size */, GL_DOUBLE, 0 /* stride */, pointer);
		verifyError(GL_INVALID_OPERATION, message.str().c_str(), __LINE__, result);
	}
}